

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O0

void __thiscall
unodb::detail::
basic_inode_4<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
::add_to_nonfull(basic_inode_4<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                 *this,db_leaf_unique_ptr *child,tree_depth_type depth,uint8_t children_count_)

{
  element_type new_value;
  uchar uVar1;
  bool bVar2;
  value_type vVar3;
  const_iterator pvVar4;
  const_iterator pvVar5;
  pointer pbVar6;
  reference peVar7;
  reference pvVar8;
  reference this_00;
  reference pvVar9;
  reference this_01;
  key_union *this_02;
  basic_node_ptr<unodb::detail::node_header> local_50;
  ulong local_48;
  size_type i;
  uint insert_pos_index;
  uint mask;
  element_type local_22;
  byte local_21;
  uint8_t key_byte;
  db_leaf_unique_ptr *pdStack_20;
  uint8_t children_count__local;
  db_leaf_unique_ptr *child_local;
  basic_inode_4<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
  *this_local;
  tree_depth_type depth_local;
  
  local_21 = children_count_;
  pdStack_20 = child;
  child_local = (db_leaf_unique_ptr *)this;
  this_local._4_4_ = depth.value;
  uVar1 = in_fake_critical_section::operator_cast_to_unsigned_char
                    ((in_fake_critical_section *)&this->field_0x8);
  if (children_count_ != uVar1) {
    __assert_fail("children_count_ == this->children_count",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                  ,0x55f,
                  "void unodb::detail::basic_inode_4<unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>>::add_to_nonfull(db_leaf_unique_ptr &&, tree_depth_type, std::uint8_t) [ArtPolicy = unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>]"
                 );
  }
  if (3 < local_21) {
    __assert_fail("children_count_ < parent_class::capacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                  ,0x560,
                  "void unodb::detail::basic_inode_4<unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>>::add_to_nonfull(db_leaf_unique_ptr &&, tree_depth_type, std::uint8_t) [ArtPolicy = unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>]"
                 );
  }
  pvVar4 = std::array<unodb::in_fake_critical_section<std::byte>,_4UL>::cbegin
                     (&(this->keys).byte_array);
  pvVar5 = std::array<unodb::in_fake_critical_section<std::byte>,_4UL>::cbegin
                     (&(this->keys).byte_array);
  bVar2 = std::is_sorted<unodb::in_fake_critical_section<std::byte>const*>(pvVar4,pvVar5 + local_21)
  ;
  if (!bVar2) {
    __assert_fail("std::is_sorted( keys.byte_array.cbegin(), keys.byte_array.cbegin() + children_count_)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                  ,0x562,
                  "void unodb::detail::basic_inode_4<unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>>::add_to_nonfull(db_leaf_unique_ptr &&, tree_depth_type, std::uint8_t) [ArtPolicy = unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>]"
                 );
  }
  pbVar6 = std::
           unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
           ::operator->(pdStack_20);
  _insert_pos_index = basic_leaf<unsigned_long,_unodb::detail::node_header>::get_key_view(pbVar6);
  vVar3 = tree_depth::operator_cast_to_unsigned_int((tree_depth *)((long)&this_local + 4));
  peVar7 = std::span<const_std::byte,_18446744073709551615UL>::operator[]
                     ((span<const_std::byte,_18446744073709551615UL> *)&insert_pos_index,
                      (ulong)vVar3);
  local_22 = *peVar7;
  i._4_4_ = (1 << (local_21 & 0x1f)) - 1;
  i._0_4_ = get_insert_pos(this,local_22,i._4_4_);
  for (local_48 = (ulong)local_21; new_value = local_22, (uint)i < local_48; local_48 = local_48 - 1
      ) {
    pvVar8 = std::array<unodb::in_fake_critical_section<std::byte>,_4UL>::operator[]
                       (&(this->keys).byte_array,local_48 - 1);
    this_00 = std::array<unodb::in_fake_critical_section<std::byte>,_4UL>::operator[]
                        (&(this->keys).byte_array,local_48);
    in_fake_critical_section<std::byte>::operator=(this_00,pvVar8);
    pvVar9 = std::
             array<unodb::in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_>,_4UL>
             ::operator[](&this->children,local_48 - 1);
    this_01 = std::
              array<unodb::in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_>,_4UL>
              ::operator[](&this->children,local_48);
    in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_>::operator=
              (this_01,pvVar9);
  }
  this_02 = &this->keys;
  pvVar8 = std::array<unodb::in_fake_critical_section<std::byte>,_4UL>::operator[]
                     (&this_02->byte_array,(ulong)(uint)i);
  in_fake_critical_section<std::byte>::operator=(pvVar8,new_value);
  pbVar6 = std::
           unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
           ::release(pdStack_20);
  basic_node_ptr<unodb::detail::node_header>::basic_node_ptr(&local_50,(header_type *)pbVar6,LEAF);
  pvVar9 = std::
           array<unodb::in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_>,_4UL>
           ::operator[](&this->children,(ulong)(uint)i);
  in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_>::operator=
            (pvVar9,local_50);
  local_21 = local_21 + 1;
  in_fake_critical_section<unsigned_char>::operator=
            ((in_fake_critical_section<unsigned_char> *)&this->field_0x8,local_21);
  pvVar4 = std::array<unodb::in_fake_critical_section<std::byte>,_4UL>::cbegin(&this_02->byte_array)
  ;
  pvVar5 = std::array<unodb::in_fake_critical_section<std::byte>,_4UL>::cbegin(&this_02->byte_array)
  ;
  bVar2 = std::is_sorted<unodb::in_fake_critical_section<std::byte>const*>(pvVar4,pvVar5 + local_21)
  ;
  if (!bVar2) {
    __assert_fail("std::is_sorted( keys.byte_array.cbegin(), keys.byte_array.cbegin() + children_count_)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                  ,0x57f,
                  "void unodb::detail::basic_inode_4<unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>>::add_to_nonfull(db_leaf_unique_ptr &&, tree_depth_type, std::uint8_t) [ArtPolicy = unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>]"
                 );
  }
  return;
}

Assistant:

constexpr void add_to_nonfull(db_leaf_unique_ptr &&child,
                                tree_depth_type depth,
                                std::uint8_t children_count_) noexcept {
    UNODB_DETAIL_ASSERT(children_count_ == this->children_count);
    UNODB_DETAIL_ASSERT(children_count_ < parent_class::capacity);
    UNODB_DETAIL_ASSERT(std::is_sorted(
        keys.byte_array.cbegin(), keys.byte_array.cbegin() + children_count_));

    const auto key_byte =
        static_cast<std::uint8_t>(child->get_key_view()[depth]);

#ifdef UNODB_DETAIL_X86_64
    const auto mask = (1U << children_count_) - 1;
    const auto insert_pos_index = get_insert_pos(key_byte, mask);
#else
    // This is also currently the best ARM implementation.
    const auto first_lt = ((keys.integer & 0xFFU) < key_byte) ? 1 : 0;
    const auto second_lt = (((keys.integer >> 8U) & 0xFFU) < key_byte) ? 1 : 0;
    const auto third_lt = ((keys.integer >> 16U) & 0xFFU) < key_byte ? 1 : 0;
    const auto insert_pos_index =
        static_cast<unsigned>(first_lt + second_lt + third_lt);
#endif

    for (typename decltype(keys.byte_array)::size_type i = children_count_;
         i > insert_pos_index; --i) {
      keys.byte_array[i] = keys.byte_array[i - 1];
      children[i] = children[i - 1];
    }
    keys.byte_array[insert_pos_index] = static_cast<std::byte>(key_byte);
    children[insert_pos_index] = node_ptr{child.release(), node_type::LEAF};

    ++children_count_;
    this->children_count = children_count_;

    UNODB_DETAIL_ASSERT(std::is_sorted(
        keys.byte_array.cbegin(), keys.byte_array.cbegin() + children_count_));
  }